

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O2

bool __thiscall
glcts::TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::checkLinear
          (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,GLint layer)

{
  ostringstream *poVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  undefined1 local_1b0 [384];
  
  uVar2 = (this->m_test_configuration).m_width;
  uVar7 = (this->m_test_configuration).m_height;
  uVar8 = uVar7 / 3;
  uVar10 = uVar2 >> 1;
  uVar7 = uVar7 >> 1;
  uVar17 = (this->m_test_configuration).m_n_in_components;
  uVar3 = (this->m_test_configuration).m_n_out_components;
  iVar16 = uVar3 * uVar2;
  if (uVar3 < uVar17) {
    uVar17 = uVar3;
  }
  uVar15 = (ulong)uVar17;
  puVar4 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar18 = uVar2 * uVar7 + uVar10;
  uVar12 = uVar3 * iVar18;
  uVar13 = ((uVar7 + 1) * uVar2 + uVar10) * uVar3;
  uVar17 = uVar7;
  do {
    uVar11 = uVar15;
    uVar14 = uVar13;
    uVar5 = uVar12;
    if (uVar7 + uVar8 <= uVar17) {
      uVar13 = iVar18 * uVar3;
      uVar12 = (uVar2 * (uVar7 - 1) + uVar10) * uVar3;
      for (uVar17 = uVar7; uVar11 = uVar15, uVar14 = uVar12, uVar5 = uVar13, uVar7 - uVar8 < uVar17;
          uVar17 = uVar17 - 1) {
        while( true ) {
          uVar9 = (ulong)uVar5;
          uVar6 = (ulong)uVar14;
          if (uVar11 == 0) break;
          uVar11 = uVar11 - 1;
          uVar14 = uVar14 + 1;
          uVar5 = uVar5 + 1;
          if (puVar4[uVar6] < puVar4[uVar9]) {
            local_1b0._0_8_ =
                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"For layer (");
            std::ostream::operator<<(poVar1,layer);
            std::operator<<((ostream *)poVar1,") when moving from center point  (x, y)  = (");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,",");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,") to the top\n");
            std::operator<<((ostream *)poVar1,"at point (x, y)  = (");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,",");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,
                            ")- texel values stopped to be monotonically increasing\n");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00cbe25f;
          }
        }
        uVar13 = uVar13 - iVar16;
        uVar12 = uVar12 - iVar16;
      }
      uVar12 = uVar3 * uVar10 + uVar7;
      uVar8 = (uVar10 + 1) * uVar3 + uVar7;
      for (uVar17 = uVar10; uVar11 = uVar15, uVar14 = uVar12, uVar13 = uVar8,
          uVar17 < uVar10 + uVar2 / 3; uVar17 = uVar17 + 1) {
        while( true ) {
          uVar6 = (ulong)uVar13;
          if (uVar11 == 0) break;
          uVar9 = (ulong)uVar14;
          uVar11 = uVar11 - 1;
          uVar14 = uVar14 + 1;
          uVar13 = uVar13 + 1;
          if (puVar4[uVar6] < puVar4[uVar9]) {
            local_1b0._0_8_ =
                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"For layer (");
            std::ostream::operator<<(poVar1,layer);
            std::operator<<((ostream *)poVar1,") when moving from center point  (x, y) = (");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,",");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,") to the right\n");
            std::operator<<((ostream *)poVar1,"at point (x, y)  = (");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,",");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,
                            ")- texel values stopped to be monotonically increasing\n");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00cbe25f;
          }
        }
        uVar12 = uVar12 + uVar3;
        uVar8 = uVar8 + uVar3;
      }
      uVar17 = (uVar3 + 1) * uVar7;
      do {
        uVar11 = uVar15;
        uVar8 = uVar17;
        if (uVar7 <= uVar10 - uVar2 / 3) {
          return true;
        }
        while (uVar11 != 0) {
          uVar12 = uVar8 - uVar3;
          uVar6 = (ulong)uVar8;
          uVar11 = uVar11 - 1;
          uVar8 = uVar8 + 1;
          if (puVar4[uVar12] < puVar4[uVar6]) {
            local_1b0._0_8_ =
                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"For layer (");
            std::ostream::operator<<(poVar1,layer);
            std::operator<<((ostream *)poVar1,") when moving from center point  (x, y) = (");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,",");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,") to the left\n");
            std::operator<<((ostream *)poVar1,"at point (x, y)  = (");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,",");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,
                            ")- texel values stopped to be monotonically increasing\n");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00cbe25f;
          }
        }
        uVar7 = uVar7 - 1;
        uVar17 = uVar17 - uVar3;
      } while( true );
    }
    while( true ) {
      uVar9 = (ulong)uVar5;
      uVar6 = (ulong)uVar14;
      if (uVar11 == 0) break;
      uVar11 = uVar11 - 1;
      uVar14 = uVar14 + 1;
      uVar5 = uVar5 + 1;
      if (puVar4[uVar6] < puVar4[uVar9]) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"For layer (");
        std::ostream::operator<<(poVar1,layer);
        std::operator<<((ostream *)poVar1,") when moving from center point  (x, y)  = (");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,",");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,") to the bottom\n");
        std::operator<<((ostream *)poVar1,"at point (x, y)  = (");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,",");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,
                        ") - texel values stopped to be monotonically increasing\n");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00cbe25f:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        return false;
      }
    }
    uVar17 = uVar17 + 1;
    uVar12 = uVar12 + iVar16;
    uVar13 = uVar13 + iVar16;
  } while( true );
}

Assistant:

bool TextureBorderClampSamplingTexture<InputType, OutputType>::checkLinear(std::vector<OutputType>& buffer,
																		   glw::GLint layer)
{
	glw::GLuint centerX = m_test_configuration.get_width() / 2;
	glw::GLuint centerY = m_test_configuration.get_height() / 2;
	glw::GLuint stepX   = m_test_configuration.get_width() / 3;
	glw::GLuint stepY   = m_test_configuration.get_height() / 3;

	glw::GLuint index = 0;

	glw::GLuint in_components  = m_test_configuration.get_n_in_components();
	glw::GLuint out_components = m_test_configuration.get_n_out_components();
	glw::GLuint outRowWidth	= m_test_configuration.get_width() * out_components;

	/* Check values from center to the bottom */
	for (glw::GLuint y = centerY; y < centerY + stepY; ++y)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = y * outRowWidth + centerX * out_components + c;
			if (buffer[index + outRowWidth] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y)  = (" << centerX << "," << centerY
								   << ") to the bottom\n"
								   << "at point (x, y)  = (" << centerX << "," << y
								   << ") - texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	/* Check values from center to the top */
	for (glw::GLuint y = centerY; y > centerY - stepY; --y)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = y * outRowWidth + centerX * out_components + c;
			if (buffer[index - outRowWidth] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y)  = (" << centerX << "," << centerY
								   << ") to the top\n"
								   << "at point (x, y)  = (" << centerX << "," << y
								   << ")- texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	/* Check values from center to the right */
	for (glw::GLuint x = centerX; x < centerX + stepX; ++x)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = centerY + x * out_components + c;
			if (buffer[index + out_components] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y) = (" << centerX << "," << centerY
								   << ") to the right\n"
								   << "at point (x, y)  = (" << x << "," << centerY
								   << ")- texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	/* Check values from center to the left */
	for (glw::GLuint x = centerY; x > centerX - stepX; --x)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = centerY + x * out_components + c;
			if (buffer[index - out_components] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y) = (" << centerX << "," << centerY
								   << ") to the left\n"
								   << "at point (x, y)  = (" << x << "," << centerY
								   << ")- texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	return true;
}